

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

void wwShLo(word *a,size_t n,size_t shift)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (shift < n << 6) {
    uVar4 = shift >> 6;
    if ((shift & 0x3f) == 0) {
      if (uVar4 < n) {
        uVar3 = 0;
        do {
          a[uVar3] = a[uVar4 + uVar3];
          uVar3 = uVar3 + 1;
        } while (n - uVar4 != uVar3);
      }
      else {
        uVar3 = 0;
      }
    }
    else {
      if (uVar4 + 1 < n) {
        lVar2 = 0;
        do {
          bVar1 = (byte)shift & 0x3f;
          a[lVar2] = a[uVar4 + lVar2] >> bVar1 | a[uVar4 + lVar2 + 1] << 0x40 - bVar1;
          lVar2 = lVar2 + 1;
        } while (~uVar4 + n != lVar2);
        uVar4 = uVar4 + lVar2;
      }
      else {
        lVar2 = 0;
      }
      a[lVar2] = a[uVar4] >> (sbyte)(shift & 0x3f);
      uVar3 = lVar2 + 1;
    }
    bVar5 = n < uVar3;
    n = n - uVar3;
    if (bVar5 || n == 0) {
      return;
    }
    a = a + uVar3;
  }
  else if (n == 0) {
    return;
  }
  memset(a,0,n << 3);
  return;
}

Assistant:

void wwShLo(word a[], size_t n, size_t shift)
{
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * n)
	{
		size_t wshift = shift / B_PER_W, pos;
		// величина сдвига не кратна длине слова?
		if (shift %= B_PER_W)
		{
			// сдвиг всех слов, кроме последнего
			for (pos = 0; pos + wshift + 1 < n; pos++)
				a[pos] = a[pos + wshift] >> shift |
					a[pos + wshift + 1] << (B_PER_W - shift);
			// последнее слово
			ASSERT(pos + wshift < n);
			a[pos] = a[pos + wshift] >> shift;
			++pos;
		}
		// величина сдвига кратна длине слова
		else for (pos = 0; pos + wshift < n; pos++)
			a[pos] = a[pos + wshift];
		// обнуление последних слов
		for (; pos < n; a[pos++] = 0);
	}
	else
		wwSetZero(a, n);
}